

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

void __thiscall
glslang::TSymbolTable::setVariableExtensions
          (TSymbolTable *this,char *blockName,char *name,int numExts,char **extensions)

{
  int iVar1;
  TSymbol *pTVar2;
  undefined4 extraout_var;
  long *plVar4;
  TType *this_00;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_01;
  size_type sVar5;
  const_reference pvVar6;
  undefined4 extraout_var_00;
  int local_7c;
  int member;
  TTypeList *structure;
  TVariable *variable;
  TString local_60;
  TSymbol *local_38;
  TSymbol *symbol;
  char **extensions_local;
  char *pcStack_20;
  int numExts_local;
  char *name_local;
  char *blockName_local;
  TSymbolTable *this_local;
  long *plVar3;
  
  symbol = (TSymbol *)extensions;
  extensions_local._4_4_ = numExts;
  pcStack_20 = name;
  name_local = blockName;
  blockName_local = (char *)this;
  pool_allocator<char>::pool_allocator((pool_allocator<char> *)&variable);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_60,
             blockName,(pool_allocator<char> *)&variable);
  pTVar2 = find(this,&local_60,(bool *)0x0,(bool *)0x0,(int *)0x0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_60);
  if (pTVar2 != (TSymbol *)0x0) {
    local_38 = pTVar2;
    iVar1 = (*pTVar2->_vptr_TSymbol[9])();
    plVar3 = (long *)CONCAT44(extraout_var,iVar1);
    if (plVar3 == (long *)0x0) {
      __assert_fail("variable != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                    ,0x38a,
                    "void glslang::TSymbolTable::setVariableExtensions(const char *, const char *, int, const char *const *)"
                   );
    }
    plVar4 = (long *)(**(code **)(*plVar3 + 0x48))();
    this_00 = (TType *)(**(code **)(*plVar4 + 0x60))();
    this_01 = &TType::getStruct(this_00)->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    for (local_7c = 0;
        sVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                          (this_01), local_7c < (int)sVar5; local_7c = local_7c + 1) {
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](this_01,(long)local_7c);
      iVar1 = (*pvVar6->type->_vptr_TType[6])();
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)CONCAT44(extraout_var_00,iVar1),pcStack_20);
      if (iVar1 == 0) {
        (**(code **)(*plVar3 + 0xf0))(plVar3,local_7c,extensions_local._4_4_,symbol);
        return;
      }
    }
  }
  return;
}

Assistant:

void setVariableExtensions(const char* blockName, const char* name, int numExts, const char* const extensions[])
    {
        TSymbol* symbol = find(TString(blockName));
        if (symbol == nullptr)
            return;
        TVariable* variable = symbol->getAsVariable();
        assert(variable != nullptr);

        const TTypeList& structure = *variable->getAsVariable()->getType().getStruct();
        for (int member = 0; member < (int)structure.size(); ++member) {
            if (structure[member].type->getFieldName().compare(name) == 0) {
                variable->setMemberExtensions(member, numExts, extensions);
                return;
            }
        }
    }